

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mpi_impl.cpp
# Opt level: O1

int Al::internal::mpi::init(EVP_PKEY_CTX *ctx)

{
  int iVar1;
  int extraout_EAX;
  MPICommAndStreamWrapper<int> *this;
  MPI_Comm in_RDX;
  undefined1 auVar2 [16];
  int flag;
  int *p;
  int local_134;
  int local_130;
  undefined4 uStack_12c;
  string local_128;
  string local_108;
  string local_e8;
  string local_c8;
  string local_a8;
  string local_88;
  string local_68;
  string local_48;
  
  MPI_Initialized(&local_134);
  if (local_134 == 0) {
    iVar1 = MPI_Init_thread(ctx);
    if (iVar1 != 0) {
      auVar2 = __cxa_allocate_exception(0x70);
      build_string<char_const(&)[26]>(&local_48,(Al *)"MPI initialization failed",auVar2._8_8_);
      local_c8._M_dataplus._M_p = (pointer)&local_c8.field_2;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_c8,
                 "/workspace/llm4binary/github/license_c_cmakelists/LLNL[P]Aluminum/src/mpi_impl.cpp"
                 ,"");
      al_exception::al_exception(auVar2._0_8_,&local_48,&local_c8,0xa0);
      __cxa_throw(auVar2._0_8_,&al_exception::typeinfo,al_exception::~al_exception);
    }
    if (local_130 < 3) {
      auVar2 = __cxa_allocate_exception(0x70);
      build_string<char_const(&)[32]>
                (&local_68,(Al *)"Insufficient MPI thread support",auVar2._8_8_);
      local_e8._M_dataplus._M_p = (pointer)&local_e8.field_2;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_e8,
                 "/workspace/llm4binary/github/license_c_cmakelists/LLNL[P]Aluminum/src/mpi_impl.cpp"
                 ,"");
      al_exception::al_exception(auVar2._0_8_,&local_68,&local_e8,0xa3);
      __cxa_throw(auVar2._0_8_,&al_exception::typeinfo,al_exception::~al_exception);
    }
    (anonymous_namespace)::initialized_mpi = 1;
  }
  else {
    MPI_Query_thread(&local_130);
    if (local_130 < 3) {
      auVar2 = __cxa_allocate_exception(0x70);
      build_string<char_const(&)[57]>
                (&local_88,(Al *)"MPI already initialized with insufficient thread support",
                 auVar2._8_8_);
      local_108._M_dataplus._M_p = (pointer)&local_108.field_2;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_108,
                 "/workspace/llm4binary/github/license_c_cmakelists/LLNL[P]Aluminum/src/mpi_impl.cpp"
                 ,"");
      al_exception::al_exception(auVar2._0_8_,&local_88,&local_108,0xac);
      __cxa_throw(auVar2._0_8_,&al_exception::typeinfo,al_exception::~al_exception);
    }
  }
  MPI_Initialized(&local_134);
  if (local_134 != 0) {
    MPI_Comm_get_attr(&ompi_mpi_comm_world,0,&local_130,&local_134);
    (anonymous_namespace)::max_tag = *(undefined4 *)CONCAT44(uStack_12c,local_130);
    this = (MPICommAndStreamWrapper<int> *)operator_new(0x30);
    MPICommAndStreamWrapper<int>::MPICommAndStreamWrapper(this,in_RDX,0);
    this[1].stream = 10;
    (anonymous_namespace)::al_world_comm = this;
    return extraout_EAX;
  }
  auVar2 = __cxa_allocate_exception(0x70);
  build_string<char_const(&)[25]>(&local_a8,(Al *)"Failed to initialize MPI",auVar2._8_8_);
  local_128._M_dataplus._M_p = (pointer)&local_128.field_2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_128,
             "/workspace/llm4binary/github/license_c_cmakelists/LLNL[P]Aluminum/src/mpi_impl.cpp",""
            );
  al_exception::al_exception(auVar2._0_8_,&local_a8,&local_128,0xb4);
  __cxa_throw(auVar2._0_8_,&al_exception::typeinfo,al_exception::~al_exception);
}

Assistant:

void init(int& argc, char**& argv, MPI_Comm world_comm) {
  int flag;
#ifdef AL_MPI_SERIALIZE
  int required = MPI_THREAD_SERIALIZED;
#else
  int required = MPI_THREAD_MULTIPLE;
#endif
  MPI_Initialized(&flag);
  if (!flag) {
    int provided;
    int result = MPI_Init_thread(&argc, &argv, required, &provided);
    if (result != MPI_SUCCESS) {
      throw_al_exception("MPI initialization failed");
    }
    if (provided < required) {
      throw_al_exception("Insufficient MPI thread support");
    }
    initialized_mpi = true;
  } else {
    // Ensure that we have sufficient threading support in MPI.
    int provided;
    MPI_Query_thread(&provided);
    if (provided < required) {
      throw_al_exception(
        "MPI already initialized with insufficient thread support");
    }
  }
  // Some MPI implementations may return MPI_SUCCESS despite initialization
  // failing. This second check is a weak attempt to double-check whether
  // initialization actually worked.
  MPI_Initialized(&flag);
  if (!flag) {
    throw_al_exception("Failed to initialize MPI");
  }
  // Get the upper bound for tags; this is always set in MPI_COMM_WORLD.
  // This explicitly uses MPI_COMM_WORLD rather than world_comm because of this.
  int* p;
  MPI_Comm_get_attr(MPI_COMM_WORLD, MPI_TAG_UB, &p, &flag);
  max_tag = *p;

  al_world_comm = new MPICommunicator(world_comm);

#ifdef AL_HAS_HALF
  // Set up reduction operators for half.
  MPI_Op_create(&half_sum_reduction, true, &half_sum_op);
  MPI_Op_create(&half_prod_reduction, true, &half_prod_op);
  MPI_Op_create(&half_min_reduction, true, &half_min_op);
  MPI_Op_create(&half_max_reduction, true, &half_max_op);
#endif

#ifdef AL_HAS_BFLOAT
  // Set up reduction operators for bfloat.
  MPI_Op_create(&bfloat_sum_reduction, true, &bfloat_sum_op);
  MPI_Op_create(&bfloat_prod_reduction, true, &bfloat_prod_op);
  MPI_Op_create(&bfloat_min_reduction, true, &bfloat_min_op);
  MPI_Op_create(&bfloat_max_reduction, true, &bfloat_max_op);
#endif
}